

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oss.cpp
# Opt level: O3

int __thiscall anon_unknown.dwarf_26d854::OSSPlayback::mixerProc(OSSPlayback *this)

{
  ALCdevice *pAVar1;
  FILE *pFVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  ssize_t sVar7;
  int *piVar8;
  char *pcVar9;
  size_t __n;
  pointer outBuffer;
  pollfd local_40;
  ulong local_38;
  
  SetRTPriority();
  althrd_setname("alsoft-mixer");
  pAVar1 = (this->super_BackendBase).mDevice;
  uVar3 = ChannelsFromDevFmt(pAVar1->FmtChans,pAVar1->mAmbiOrder);
  pAVar1 = (this->super_BackendBase).mDevice;
  uVar4 = BytesFromDevFmt(pAVar1->FmtType);
  uVar5 = ChannelsFromDevFmt(pAVar1->FmtChans,pAVar1->mAmbiOrder);
  if (((this->mKillNow)._M_base._M_i & 1U) == 0) {
    local_38 = (ulong)uVar3;
    do {
      if (((((this->super_BackendBase).mDevice)->Connected)._M_base._M_i & 1U) == 0) {
        return 0;
      }
      local_40.events = 4;
      local_40.revents = 0;
      local_40.fd = this->mFd;
      iVar6 = poll(&local_40,1,1000);
      if (iVar6 < 0) {
        piVar8 = __errno_location();
        pFVar2 = gLogFile;
        iVar6 = *piVar8;
        if ((iVar6 != 4) && (iVar6 != 0xb)) {
          if (0 < (int)gLogLevel) {
            pcVar9 = strerror(iVar6);
            fprintf((FILE *)pFVar2,"[ALSOFT] (EE) poll failed: %s\n",pcVar9);
            iVar6 = *piVar8;
          }
          pAVar1 = (this->super_BackendBase).mDevice;
          pcVar9 = strerror(iVar6);
          ALCdevice::handleDisconnect(pAVar1,"Failed waiting for playback buffer: %s",pcVar9);
          return 0;
        }
      }
      else if (iVar6 == 0) {
        if (1 < (int)gLogLevel) {
          _GLOBAL__N_1::OSSPlayback::mixerProc();
        }
      }
      else {
        outBuffer = (this->mMixData).
                    super__Vector_base<unsigned_char,_al::allocator<unsigned_char,_1UL>_>._M_impl.
                    super__Vector_impl_data._M_start;
        __n = (long)(this->mMixData).
                    super__Vector_base<unsigned_char,_al::allocator<unsigned_char,_1UL>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)outBuffer;
        ALCdevice::renderSamples
                  ((this->super_BackendBase).mDevice,outBuffer,(ALuint)(__n / (uVar5 * uVar4)),
                   local_38);
        do {
          while( true ) {
            if ((__n == 0) || (((this->mKillNow)._M_base._M_i & 1U) != 0)) goto LAB_00164506;
            sVar7 = write(this->mFd,outBuffer,__n);
            if (sVar7 < 0) break;
            __n = __n - sVar7;
            outBuffer = outBuffer + sVar7;
          }
          piVar8 = __errno_location();
          pFVar2 = gLogFile;
          iVar6 = *piVar8;
        } while ((iVar6 == 4) || (iVar6 == 0xb));
        if (0 < (int)gLogLevel) {
          pcVar9 = strerror(iVar6);
          fprintf((FILE *)pFVar2,"[ALSOFT] (EE) write failed: %s\n",pcVar9);
          iVar6 = *piVar8;
        }
        pAVar1 = (this->super_BackendBase).mDevice;
        pcVar9 = strerror(iVar6);
        ALCdevice::handleDisconnect(pAVar1,"Failed writing playback samples: %s",pcVar9);
      }
LAB_00164506:
    } while (((this->mKillNow)._M_base._M_i & 1U) == 0);
  }
  return 0;
}

Assistant:

int OSSPlayback::mixerProc()
{
    SetRTPriority();
    althrd_setname(MIXER_THREAD_NAME);

    const size_t frame_step{mDevice->channelsFromFmt()};
    const ALuint frame_size{mDevice->frameSizeFromFmt()};

    while(!mKillNow.load(std::memory_order_acquire) &&
          mDevice->Connected.load(std::memory_order_acquire))
    {
        pollfd pollitem{};
        pollitem.fd = mFd;
        pollitem.events = POLLOUT;

        int pret{poll(&pollitem, 1, 1000)};
        if(pret < 0)
        {
            if(errno == EINTR || errno == EAGAIN)
                continue;
            ERR("poll failed: %s\n", strerror(errno));
            mDevice->handleDisconnect("Failed waiting for playback buffer: %s", strerror(errno));
            break;
        }
        else if(pret == 0)
        {
            WARN("poll timeout\n");
            continue;
        }

        ALubyte *write_ptr{mMixData.data()};
        size_t to_write{mMixData.size()};
        mDevice->renderSamples(write_ptr, static_cast<ALuint>(to_write/frame_size), frame_step);
        while(to_write > 0 && !mKillNow.load(std::memory_order_acquire))
        {
            ssize_t wrote{write(mFd, write_ptr, to_write)};
            if(wrote < 0)
            {
                if(errno == EAGAIN || errno == EWOULDBLOCK || errno == EINTR)
                    continue;
                ERR("write failed: %s\n", strerror(errno));
                mDevice->handleDisconnect("Failed writing playback samples: %s", strerror(errno));
                break;
            }

            to_write -= static_cast<size_t>(wrote);
            write_ptr += wrote;
        }
    }

    return 0;
}